

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O1

REF_STATUS ref_export_msh2(REF_GRID ref_grid,char *filename)

{
  REF_NODE pRVar1;
  REF_GLOB *pRVar2;
  REF_DBL *pRVar3;
  REF_CELL ref_cell;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 uVar9;
  REF_STATUS RVar10;
  FILE *__stream;
  void *__ptr;
  void *pvVar11;
  ulong uVar12;
  long lVar13;
  REF_STATUS unaff_EBP;
  char *pcVar14;
  REF_INT cell;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  REF_GRID pRVar18;
  uint local_c4;
  uint local_b8 [4];
  uint uStack_a8;
  uint local_a4;
  uint local_a0;
  undefined4 local_9c;
  ulong local_98;
  REF_GRID local_48;
  void *local_40;
  long local_38;
  
  pRVar1 = ref_grid->node;
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x950,
           "ref_export_msh2","unable to open file");
    return 2;
  }
  fprintf(__stream,"$MeshFormat\n%3.1f %d %d\n$EndMeshFormat\n",0x400199999999999a,0);
  local_48 = ref_grid;
  if ((long)pRVar1->max < 0) {
    unaff_EBP = 1;
    pcVar14 = "malloc o2n of REF_INT negative";
LAB_0015e768:
    bVar4 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x955,
           "ref_export_msh2",pcVar14);
    __ptr = (void *)0x0;
  }
  else {
    __ptr = malloc((long)pRVar1->max << 2);
    if (__ptr == (void *)0x0) {
      unaff_EBP = 2;
      pcVar14 = "malloc o2n of REF_INT NULL";
      goto LAB_0015e768;
    }
    bVar4 = true;
    if (0 < pRVar1->max) {
      lVar13 = 0;
      do {
        *(undefined4 *)((long)__ptr + lVar13 * 4) = 0xffffffff;
        lVar13 = lVar13 + 1;
      } while (lVar13 < pRVar1->max);
    }
  }
  if (!bVar4) {
    return unaff_EBP;
  }
  if ((long)pRVar1->max < 0) {
    unaff_EBP = 1;
    pcVar14 = "malloc n2o of REF_INT negative";
  }
  else {
    pvVar11 = malloc((long)pRVar1->max << 2);
    if (pvVar11 != (void *)0x0) {
      bVar4 = true;
      if (0 < pRVar1->max) {
        lVar13 = 0;
        do {
          *(undefined4 *)((long)pvVar11 + lVar13 * 4) = 0xffffffff;
          lVar13 = lVar13 + 1;
        } while (lVar13 < pRVar1->max);
      }
      goto LAB_0015e821;
    }
    unaff_EBP = 2;
    pcVar14 = "malloc n2o of REF_INT NULL";
  }
  bVar4 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x956,
         "ref_export_msh2",pcVar14);
  pvVar11 = (void *)0x0;
LAB_0015e821:
  if (bVar4) {
    if (pRVar1->max < 1) {
      uVar12 = 0;
    }
    else {
      pRVar2 = pRVar1->global;
      lVar13 = 0;
      uVar12 = 0;
      do {
        if (-1 < pRVar2[lVar13]) {
          iVar15 = (int)uVar12;
          *(int *)((long)__ptr + lVar13 * 4) = iVar15;
          *(int *)((long)pvVar11 + (long)iVar15 * 4) = (int)lVar13;
          uVar12 = (ulong)(iVar15 + 1);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < pRVar1->max);
    }
    fprintf(__stream,"$Nodes\n%d\n",uVar12);
    if (0 < (int)uVar12) {
      uVar17 = 0;
      do {
        pRVar3 = pRVar1->real;
        lVar13 = (long)*(int *)((long)pvVar11 + uVar17 * 4);
        uVar17 = uVar17 + 1;
        fprintf(__stream,"%d %.16E %.16E %.16E\n",pRVar3[lVar13 * 0xf],pRVar3[lVar13 * 0xf + 1],
                pRVar3[lVar13 * 0xf + 2],uVar17 & 0xffffffff);
      } while (uVar12 != uVar17);
    }
    local_40 = pvVar11;
    fwrite("$EndNodes\n",10,1,__stream);
    pRVar18 = local_48;
    lVar13 = 0;
    uVar12 = 0;
    do {
      iVar15 = local_48->cell[lVar13]->n;
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      uVar12 = (ulong)(uint)((int)uVar12 + iVar15);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x10);
    fprintf(__stream,"$Elements\n%d\n",uVar12);
    lVar13 = 0;
    uVar16 = 0;
    do {
      ref_cell = pRVar18->cell[lVar13];
      local_38 = lVar13;
      if (0 < ref_cell->n) {
        switch(ref_cell->type) {
        case REF_CELL_EDG:
          local_c4 = 1;
          break;
        case REF_CELL_ED2:
          local_c4 = 8;
          break;
        case REF_CELL_ED3:
          local_c4 = 0x1a;
          break;
        case REF_CELL_TRI:
          local_c4 = 2;
          break;
        case REF_CELL_TR2:
          local_c4 = 9;
          break;
        case REF_CELL_TR3:
          local_c4 = 0x15;
          break;
        case REF_CELL_QUA:
          local_c4 = 3;
          break;
        case REF_CELL_QU2:
        case REF_CELL_PY2:
        case REF_CELL_PR2:
        case REF_CELL_HE2:
          return 6;
        case REF_CELL_TET:
          local_c4 = 4;
          break;
        case REF_CELL_PYR:
          local_c4 = 7;
          break;
        case REF_CELL_PRI:
          local_c4 = 6;
          break;
        case REF_CELL_HEX:
          local_c4 = 5;
          break;
        case REF_CELL_TE2:
          local_c4 = 0xb;
          break;
        default:
          local_c4 = 0xffffffff;
        }
        if (0 < ref_cell->max) {
          cell = 0;
          do {
            RVar10 = ref_cell_nodes(ref_cell,cell,(REF_INT *)local_b8);
            uVar9 = local_9c;
            uVar7 = uStack_a8;
            uVar6 = local_b8[3];
            uVar5 = local_b8[0];
            if (RVar10 == 0) {
              if (ref_cell->type == REF_CELL_PYR) {
                local_b8[3] = local_b8[1];
                uStack_a8 = local_b8[2];
                local_b8[1] = uVar6;
                local_b8[2] = uVar7;
              }
              uVar7 = local_b8[3];
              uVar6 = local_b8[1];
              if (ref_cell->type == REF_CELL_TE2) {
                local_98 = local_98 << 0x20 | local_98 >> 0x20;
              }
              if (ref_cell->type == REF_CELL_TRI) {
                local_b8[0] = local_b8[2];
                local_b8[2] = uVar5;
              }
              uVar5 = local_b8[0];
              if (ref_cell->type == REF_CELL_TR2) {
                local_b8[0] = local_b8[2];
                local_b8[2] = uVar5;
                local_b8[3] = uStack_a8;
                uStack_a8 = uVar7;
              }
              uVar8 = uStack_a8;
              uVar7 = local_b8[3];
              uVar5 = local_b8[0];
              if (ref_cell->type == REF_CELL_TR2) {
                local_b8[0] = local_b8[2];
                local_b8[2] = uVar5;
                local_b8[3] = local_a0;
                uStack_a8 = local_a4;
                local_a4 = uVar7;
                local_a0 = uVar8;
                local_9c = (undefined4)local_98;
                local_98 = CONCAT44(local_98._4_4_,uVar9);
              }
              uVar5 = local_b8[0];
              if (ref_cell->type == REF_CELL_QUA) {
                local_b8[0] = local_b8[3];
                local_b8[1] = local_b8[2];
                local_b8[2] = uVar6;
                local_b8[3] = uVar5;
              }
              uVar16 = uVar16 + 1;
              fprintf(__stream,"%d %d %d",(ulong)uVar16,(ulong)local_c4,2);
              if (ref_cell->last_node_is_an_id == 0) {
                uVar17 = 0;
                uVar12 = 0;
              }
              else {
                uVar12 = (ulong)local_b8[ref_cell->node_per];
                uVar17 = (ulong)local_b8[ref_cell->node_per];
              }
              fprintf(__stream," %d %d",uVar17,uVar12);
              if (0 < ref_cell->node_per) {
                lVar13 = 0;
                do {
                  fprintf(__stream," %d",(ulong)(local_b8[lVar13] + 1));
                  lVar13 = lVar13 + 1;
                } while (lVar13 < ref_cell->node_per);
              }
              fputc(10,__stream);
            }
            cell = cell + 1;
          } while (cell < ref_cell->max);
        }
      }
      lVar13 = local_38 + 1;
      pRVar18 = local_48;
    } while (lVar13 != 0x10);
    fwrite("$EndElements\n",0xd,1,__stream);
    if (local_40 != (void *)0x0) {
      free(local_40);
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    fclose(__stream);
    unaff_EBP = 0;
  }
  return unaff_EBP;
}

Assistant:

REF_FCN static REF_STATUS ref_export_msh2(REF_GRID ref_grid,
                                          const char *filename) {
  FILE *f;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node, nnode;
  REF_INT *o2n, *n2o;
  REF_INT group;
  REF_INT ncell;
  REF_INT type, ntag;
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell_node;

  double version = 2.2;
  int filetype =
      0; /* file-type(ASCII int; 0 for ASCII mode, 1 for binary mode) */
  int datasize = 8; /* data-size(ASCII int; sizeof(size_t)) */

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "$MeshFormat\n%3.1f %d %d\n$EndMeshFormat\n", version, filetype,
          datasize);

  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  ref_malloc_init(n2o, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    o2n[node] = nnode;
    n2o[nnode] = node;
    nnode++;
  }
  fprintf(f, "$Nodes\n%d\n", nnode);
  for (node = 0; node < nnode; node++) {
    fprintf(f, "%d %.16E %.16E %.16E\n", node + 1,
            ref_node_xyz(ref_node, 0, n2o[node]),
            ref_node_xyz(ref_node, 1, n2o[node]),
            ref_node_xyz(ref_node, 2, n2o[node]));
  }
  fprintf(f, "$EndNodes\n");

  ncell = 0;
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    if (0 < ref_cell_n(ref_cell)) {
      ncell += ref_cell_n(ref_cell);
    }
  }

  fprintf(f, "$Elements\n%d\n", ncell);
  ncell = 0;
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    if (0 < ref_cell_n(ref_cell)) {
      type = REF_EMPTY;
      switch (ref_cell_type(ref_cell)) {
        case REF_CELL_EDG:
          type = 1;
          break;
        case REF_CELL_ED2:
          type = 8;
          break;
        case REF_CELL_ED3:
          type = 26;
          break;
        case REF_CELL_TRI:
          type = 2;
          break;
        case REF_CELL_TR2:
          type = 9;
          break;
        case REF_CELL_TR3:
          type = 21;
          break;
        case REF_CELL_QUA:
          type = 3;
          break;
        case REF_CELL_TET:
          type = 4;
          break;
        case REF_CELL_TE2:
          type = 11;
          break;
        case REF_CELL_PYR:
          type = 7;
          break;
        case REF_CELL_PRI:
          type = 6;
          break;
        case REF_CELL_HEX:
          type = 5;
          break;
        case REF_CELL_QU2:
        case REF_CELL_PY2:
        case REF_CELL_PR2:
        case REF_CELL_HE2:
          return REF_IMPLEMENT;
      }
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        if (REF_CELL_PYR == ref_cell_type(ref_cell)) { /* on side */
          REF_INT n0, n1, n2, n3, n4;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          n3 = nodes[3];
          n4 = nodes[4];
          nodes[0] = n0;
          nodes[3] = n1;
          nodes[4] = n2;
          nodes[1] = n3;
          nodes[2] = n4;
        }
        if (REF_CELL_TE2 == ref_cell_type(ref_cell)) { /* swap 8-9 */
          REF_INT n9;
          n9 = nodes[9];
          nodes[9] = nodes[8];
          nodes[8] = n9;
        }
        if (REF_CELL_TRI == ref_cell_type(ref_cell)) { /* outward normal */
          REF_INT n0, n1, n2;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          nodes[0] = n2;
          nodes[1] = n1;
          nodes[2] = n0;
        }
        if (REF_CELL_TR2 == ref_cell_type(ref_cell)) { /* outward normal */
          REF_INT n0, n1, n2, n3, n4, n5;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          n3 = nodes[3];
          n4 = nodes[4];
          n5 = nodes[5];
          nodes[0] = n2;
          nodes[1] = n1;
          nodes[2] = n0;
          nodes[3] = n4;
          nodes[4] = n3;
          nodes[5] = n5;
        }
        if (REF_CELL_TR2 == ref_cell_type(ref_cell)) { /* outward normal */
          REF_INT n0, n1, n2, n3, n4, n5, n6, n7, n8, n9;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          n3 = nodes[3];
          n4 = nodes[4];
          n5 = nodes[5];
          n6 = nodes[6];
          n7 = nodes[7];
          n8 = nodes[8];
          n9 = nodes[9];
          nodes[0] = n2;
          nodes[1] = n1;
          nodes[2] = n0;
          nodes[3] = n6;
          nodes[4] = n5;
          nodes[5] = n3;
          nodes[6] = n4;
          nodes[7] = n8;
          nodes[8] = n7;
          nodes[9] = n9;
        }
        if (REF_CELL_QUA == ref_cell_type(ref_cell)) { /* outward normal */
          REF_INT n0, n1, n2, n3;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          n3 = nodes[3];
          nodes[0] = n3;
          nodes[1] = n2;
          nodes[2] = n1;
          nodes[3] = n0;
        }
        ntag = 2;
        fprintf(f, "%d %d %d", ncell + 1, type, ntag);
        if (ref_cell_last_node_is_an_id(ref_cell)) {
          fprintf(f, " %d %d", nodes[ref_cell_id_index(ref_cell)],
                  nodes[ref_cell_id_index(ref_cell)]);
        } else {
          fprintf(f, " %d %d", 0, 0);
        }
        each_ref_cell_cell_node(ref_cell, cell_node) {
          fprintf(f, " %d", nodes[cell_node] + 1);
        }
        fprintf(f, "\n");
        ncell++;
      }
    }
  }
  fprintf(f, "$EndElements\n");

  ref_free(n2o);
  ref_free(o2n);

  fclose(f);

  return REF_SUCCESS;
}